

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCall(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                  IntrusiveList<TypeHandle> generics,SynCallArgument *argumentHead,bool allowFailure
                  )

{
  ExprBase *pEVar1;
  ArrayView<FunctionValue> functions_00;
  undefined1 local_378 [2] [12];
  undefined1 local_358 [8];
  SmallArray<FunctionValue,_32U> functions;
  bool allowFailure_local;
  SynCallArgument *argumentHead_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  IntrusiveList<TypeHandle> generics_local;
  
  functions.allocator._7_1_ = allowFailure;
  SmallArray<FunctionValue,_32U>::SmallArray
            ((SmallArray<FunctionValue,_32U> *)local_358,ctx->allocator);
  GetNodeFunctions(ctx,source,value,(SmallArray<FunctionValue,_32U> *)local_358);
  ArrayView<FunctionValue>::ArrayView<32u>
            ((ArrayView<FunctionValue> *)local_378,(SmallArray<FunctionValue,_32U> *)local_358);
  functions_00._12_4_ = 0;
  functions_00.data = (FunctionValue *)local_378[0]._0_8_;
  functions_00.count = local_378[0]._8_4_;
  pEVar1 = CreateFunctionCallOverloaded
                     (ctx,source,value,functions_00,generics,argumentHead,
                      (bool)(functions.allocator._7_1_ & 1));
  SmallArray<FunctionValue,_32U>::~SmallArray((SmallArray<FunctionValue,_32U> *)local_358);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall(ExpressionContext &ctx, SynBase *source, ExprBase *value, IntrusiveList<TypeHandle> generics, SynCallArgument *argumentHead, bool allowFailure)
{
	// Collect a set of available functions
	SmallArray<FunctionValue, 32> functions(ctx.allocator);

	GetNodeFunctions(ctx, source, value, functions);

	return CreateFunctionCallOverloaded(ctx, source, value, functions, generics, argumentHead, allowFailure);
}